

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

arg_hashtable_itr_t * arg_hashtable_itr_create(arg_hashtable_t *h)

{
  uint uVar1;
  arg_hashtable_itr_t *paVar2;
  long lVar3;
  
  paVar2 = (arg_hashtable_itr_t *)malloc(0x20);
  if (paVar2 == (arg_hashtable_itr_t *)0x0) {
    (*s_panic)("Out of memory!\n");
  }
  paVar2->h = h;
  paVar2->e = (arg_hashtable_entry *)0x0;
  paVar2->parent = (arg_hashtable_entry *)0x0;
  uVar1 = h->tablelength;
  paVar2->index = uVar1;
  if (uVar1 != 0 && h->entrycount != 0) {
    lVar3 = 0;
    do {
      if (h->table[lVar3] != (arg_hashtable_entry *)0x0) {
        paVar2->e = h->table[lVar3];
        paVar2->index = (uint)lVar3;
        return paVar2;
      }
      lVar3 = lVar3 + 1;
    } while (uVar1 != (uint)lVar3);
  }
  return paVar2;
}

Assistant:

arg_hashtable_itr_t* arg_hashtable_itr_create(arg_hashtable_t* h) {
    unsigned int i;
    unsigned int tablelength;

    arg_hashtable_itr_t* itr = (arg_hashtable_itr_t*)xmalloc(sizeof(arg_hashtable_itr_t));
    itr->h = h;
    itr->e = NULL;
    itr->parent = NULL;
    tablelength = h->tablelength;
    itr->index = tablelength;
    if (0 == h->entrycount)
        return itr;

    for (i = 0; i < tablelength; i++) {
        if (h->table[i] != NULL) {
            itr->e = h->table[i];
            itr->index = i;
            break;
        }
    }
    return itr;
}